

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmFTrapcc<(moira::Instr)202,(moira::Mode)12,0>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  u32 uVar2;
  StrWriter *this_00;
  
  uVar1 = *addr;
  uVar2 = dasmIncRead<2>(this,addr);
  if (((uVar2 & 0xffe0) != 0) && ((str->style->syntax & ~MOIRA_MIT) == GNU)) {
    *addr = uVar1;
    dasmIllegal<(moira::Instr)202,(moira::Mode)12,0>(this,str,addr,op);
    return;
  }
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Fcc)(uVar2 & 0x3f));
  StrWriter::operator<<(this_00," ");
  return;
}

Assistant:

void
Moira::dasmFTrapcc(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead(addr);
    auto cnd = __________xxxxxx (ext);

    // Catch illegal extension words
    if (str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT) {

        if (!isValidExtFPU(I, M, op, ext)) {

            addr = old;
            dasmIllegal<I, M, S>(str, addr, op);
            return;
        }
    }

    switch (S) {

        case Unsized:

            str << Ins<I>{} << Fcc{cnd} << " ";
            break;

        case Word:
        case Long:

            str << Ins<I>{} << Fcc{cnd} << Sz<S>{} << str.tab << Ims<S>(dasmIncRead<S>(addr));
            break;
    }
}